

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet_base.cpp
# Opt level: O3

bool __thiscall cppnet::CppNetBase::Connection(CppNetBase *this,string *ip,uint16_t port)

{
  uint uVar1;
  
  uVar1 = RangeRandom::Random((this->_random)._M_t.
                              super___uniq_ptr_impl<cppnet::RangeRandom,_std::default_delete<cppnet::RangeRandom>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cppnet::RangeRandom_*,_std::default_delete<cppnet::RangeRandom>_>
                              .super__Head_base<0UL,_cppnet::RangeRandom_*,_false>._M_head_impl);
  Dispatcher::Connect((this->_dispatchers).
                      super__Vector_base<std::shared_ptr<cppnet::Dispatcher>,_std::allocator<std::shared_ptr<cppnet::Dispatcher>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar1].
                      super___shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr,ip,
                      port);
  return true;
}

Assistant:

bool CppNetBase::Connection(const std::string& ip, uint16_t port) {
    uint32_t index = _random->Random();
    _dispatchers[index]->Connect(ip, port);
    return true;
}